

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

t_gobj * canvas_findhitbox(_glist *x,int xpos,int ypos,int *x1p,int *y1p,int *x2p,int *y2p)

{
  t_editor *ptVar1;
  int iVar2;
  t_selection *ptVar3;
  t_gobj *y;
  int y2;
  int x2;
  int y1;
  int x1;
  int local_58;
  int local_54;
  t_gobj *local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  *x1p = -0x7fffffff;
  y = x->gl_list;
  local_58 = xpos;
  local_54 = ypos;
  local_48 = x1p;
  local_40 = y1p;
  local_38 = x2p;
  if (y == (t_gobj *)0x0) {
    local_50 = (t_gobj *)0x0;
  }
  else {
    local_50 = (t_gobj *)0x0;
    do {
      iVar2 = canvas_hitbox(x,y,local_58,local_54,&x1,&y1,&x2,&y2);
      if ((iVar2 != 0) && (*local_48 < x1)) {
        *local_48 = x1;
        *local_40 = y1;
        *local_38 = x2;
        *y2p = y2;
        local_50 = y;
      }
      y = y->g_next;
    } while (y != (_gobj *)0x0);
  }
  ptVar1 = x->gl_editor;
  if ((((ptVar1 != (t_editor *)0x0) && (ptVar3 = ptVar1->e_selection, ptVar3 != (t_selection *)0x0))
      && (ptVar3->sel_next != (_selection *)0x0)) && (ptVar3->sel_what != (t_gobj *)0x0)) {
    do {
      ptVar3 = ptVar3->sel_next;
      if (ptVar3 == (_selection *)0x0) goto LAB_001428a9;
    } while (ptVar3->sel_what != (t_gobj *)0x0);
    if (ptVar3 == (_selection *)0x0) {
LAB_001428a9:
      ptVar3 = ptVar1->e_selection;
      if (ptVar3 != (t_selection *)0x0) {
        do {
          iVar2 = canvas_hitbox(x,ptVar3->sel_what,local_58,local_54,&x1,&y1,&x2,&y2);
          if (iVar2 != 0) {
            *local_48 = x1;
            *local_40 = y1;
            *local_38 = x2;
            *y2p = y2;
            local_50 = ptVar3->sel_what;
          }
          ptVar3 = ptVar3->sel_next;
        } while (ptVar3 != (_selection *)0x0);
      }
    }
  }
  return local_50;
}

Assistant:

static t_gobj *canvas_findhitbox(t_canvas *x, int xpos, int ypos,
    int *x1p, int *y1p, int *x2p, int *y2p)
{
    t_gobj *y, *rval = 0;
    int x1, y1, x2, y2;
    *x1p = -0x7fffffff;
    for (y = x->gl_list; y; y = y->g_next)
    {
        if (canvas_hitbox(x, y, xpos, ypos, &x1, &y1, &x2, &y2)
            && (x1 > *x1p))
                *x1p = x1, *y1p = y1, *x2p = x2, *y2p = y2, rval = y;
    }
        /* if there are at least two selected objects, we'd prefer
           to find a selected one (never mind which) to the one we got. */
    if (x->gl_editor && x->gl_editor->e_selection &&
        x->gl_editor->e_selection->sel_next && !glist_isselected(x, y))
    {
        t_selection *sel;
        for (sel = x->gl_editor->e_selection; sel; sel = sel->sel_next)
            if (canvas_hitbox(x, sel->sel_what, xpos, ypos, &x1, &y1, &x2, &y2))
                *x1p = x1, *y1p = y1, *x2p = x2, *y2p = y2,
                    rval = sel->sel_what;
    }
    return (rval);
}